

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.c
# Opt level: O1

void * dequeue(Queue *q)

{
  int iVar1;
  node *__ptr;
  void *unaff_RBX;
  
  iVar1 = q->sizeOfQueue;
  if (0 < iVar1) {
    __ptr = q->head;
    if (iVar1 == 1) {
      q->head = (node *)0x0;
      q->tail = (node *)0x0;
    }
    else {
      q->head = __ptr->next;
    }
    q->sizeOfQueue = iVar1 + -1;
    unaff_RBX = __ptr->data;
    free(__ptr);
  }
  return unaff_RBX;
}

Assistant:

void *dequeue(Queue *q) {
    if (q->sizeOfQueue > 0) {
        node *temp = q->head;

        if (q->sizeOfQueue > 1) {
            q->head = q->head->next;
        } else {
            q->head = NULL;
            q->tail = NULL;
        }

        q->sizeOfQueue--;
        void *data = temp->data;
        free(temp);
        return data;
    }
}